

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O2

REF_STATUS ref_node_bounding_box_diagonal(REF_NODE ref_node,REF_DBL *diagonal)

{
  double dVar1;
  REF_MPI ref_mpi;
  REF_DBL *pRVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  undefined8 uVar8;
  char *pcVar9;
  double dVar10;
  REF_DBL temp;
  REF_DBL max_xyz [3];
  REF_DBL min_xyz [3];
  
  ref_mpi = ref_node->ref_mpi;
  for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
    min_xyz[lVar4] = 1e+200;
    max_xyz[lVar4] = -1e+200;
  }
  uVar6 = 0;
  uVar5 = (ulong)(uint)ref_node->max;
  if (ref_node->max < 1) {
    uVar5 = uVar6;
  }
  for (uVar7 = 0; uVar7 != uVar5; uVar7 = uVar7 + 1) {
    if (-1 < ref_node->global[uVar7]) {
      pRVar2 = ref_node->real;
      for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
        dVar1 = *(double *)((long)pRVar2 + lVar4 * 8 + uVar6);
        dVar10 = min_xyz[lVar4];
        if (dVar1 <= min_xyz[lVar4]) {
          dVar10 = dVar1;
        }
        min_xyz[lVar4] = dVar10;
        dVar10 = max_xyz[lVar4];
        if (max_xyz[lVar4] <= dVar1) {
          dVar10 = dVar1;
        }
        max_xyz[lVar4] = dVar10;
      }
    }
    uVar6 = uVar6 + 0x78;
  }
  lVar4 = 0;
  do {
    if (lVar4 == 0x18) {
      if (ref_mpi->id == 0) {
        *diagonal = SQRT((max_xyz[2] - min_xyz[2]) * (max_xyz[2] - min_xyz[2]) +
                         (max_xyz[1] - min_xyz[1]) * (max_xyz[1] - min_xyz[1]) +
                         (max_xyz[0] - min_xyz[0]) * (max_xyz[0] - min_xyz[0]));
      }
      uVar3 = ref_mpi_bcast(ref_mpi,diagonal,1,3);
      if (uVar3 == 0) {
        return 0;
      }
      pcVar9 = "bcast";
      uVar8 = 0xd2f;
      goto LAB_00173cc6;
    }
    temp = *(REF_DBL *)((long)min_xyz + lVar4);
    uVar3 = ref_mpi_min(ref_mpi,&temp,(REF_DBL *)((long)min_xyz + lVar4),3);
    if (uVar3 != 0) {
      pcVar9 = "mpi min";
      uVar8 = 0xd26;
      goto LAB_00173cc6;
    }
    temp = *(REF_DBL *)((long)max_xyz + lVar4);
    uVar3 = ref_mpi_max(ref_mpi,&temp,(REF_DBL *)((long)max_xyz + lVar4),3);
    lVar4 = lVar4 + 8;
  } while (uVar3 == 0);
  pcVar9 = "mpi max";
  uVar8 = 0xd28;
LAB_00173cc6:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar8,
         "ref_node_bounding_box_diagonal",(ulong)uVar3,pcVar9);
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_node_bounding_box_diagonal(REF_NODE ref_node,
                                                  REF_DBL *diagonal) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_DBL min_xyz[3], max_xyz[3], temp;
  REF_INT node, i;
  for (i = 0; i < 3; i++) {
    min_xyz[i] = REF_DBL_MAX;
    max_xyz[i] = REF_DBL_MIN;
  }
  each_ref_node_valid_node(ref_node, node) {
    for (i = 0; i < 3; i++) {
      min_xyz[i] = MIN(min_xyz[i], ref_node_xyz(ref_node, i, node));
      max_xyz[i] = MAX(max_xyz[i], ref_node_xyz(ref_node, i, node));
    }
  }
  for (i = 0; i < 3; i++) {
    temp = min_xyz[i];
    RSS(ref_mpi_min(ref_mpi, &temp, &(min_xyz[i]), REF_DBL_TYPE), "mpi min");
    temp = max_xyz[i];
    RSS(ref_mpi_max(ref_mpi, &temp, &(max_xyz[i]), REF_DBL_TYPE), "mpi max");
  }
  if (ref_mpi_once(ref_mpi)) {
    *diagonal =
        sqrt(pow(max_xyz[0] - min_xyz[0], 2) + pow(max_xyz[1] - min_xyz[1], 2) +
             pow(max_xyz[2] - min_xyz[2], 2));
  }
  RSS(ref_mpi_bcast(ref_mpi, diagonal, 1, REF_DBL_TYPE), "bcast");
  return REF_SUCCESS;
}